

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chests.c
# Opt level: O2

void check_quest_items(dw_rom *rom)

{
  uint8_t uVar1;
  dw_chest *pdVar2;
  int iVar3;
  int iVar4;
  BOOL BVar5;
  uint64_t uVar6;
  long lVar7;
  code *pcVar8;
  
  puts("Checking quest item placement...");
  if ((rom->flags[10] & 0x30) == 0) {
    pcVar8 = is_quest_item;
  }
  else {
    puts("Disallowing Armor in Charlock...");
    pcVar8 = is_quest_item_incl_armor;
  }
  for (lVar7 = 0; lVar7 != 0x1f; lVar7 = lVar7 + 1) {
    if ((rom->chest_access[lVar7] & 0x88) != 0) {
      iVar3 = (*pcVar8)();
      if (iVar3 != 0) {
        do {
          do {
            do {
              uVar6 = mt_rand(0,0x1e);
              iVar3 = (int)uVar6;
            } while ((rom->chest_access[iVar3] & 0x88) != 0);
            iVar4 = (*pcVar8)();
          } while (iVar4 != 0);
          pdVar2 = rom->chests;
          BVar5 = is_static_chest(pdVar2 + iVar3);
        } while (BVar5 != FALSE);
        uVar1 = pdVar2[iVar3].item;
        pdVar2[iVar3].item = pdVar2[lVar7].item;
        pdVar2[lVar7].item = uVar1;
      }
    }
  }
  return;
}

Assistant:

void check_quest_items(dw_rom *rom)
{
    int i, tmp_index;
    uint8_t tmp_item;
    BOOL (*quest_item_check)(uint8_t item);

    printf("Checking quest item placement...\n");

    quest_item_check = &is_quest_item;

    if (NO_ARMOR_IN_CHARLOCK(rom)) {
        printf("Disallowing Armor in Charlock...\n");
        quest_item_check = &is_quest_item_incl_armor;
    }

    for (i=0; i < CHEST_COUNT; i++) {
        if (rom->chest_access[i] & 0x88) {
            if ((*quest_item_check)(rom->chests[i].item)) {
                do {
                    tmp_index = non_charlock_chest(rom);
                } while ((*quest_item_check)(rom->chests[tmp_index].item) 
                        || is_static_chest(&rom->chests[tmp_index]));
                tmp_item = rom->chests[tmp_index].item;
                rom->chests[tmp_index].item = rom->chests[i].item;
                rom->chests[i].item = tmp_item;
            }
        }
    }
}